

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_hash.c
# Opt level: O0

void sylvan_init_hash(void)

{
  uint64_t uVar1;
  int local_c;
  int i;
  
  for (local_c = 0; local_c < 0x1000; local_c = local_c + 1) {
    uVar1 = CWhash((long)local_c);
    sylvan_tabhash_table[local_c] = uVar1;
  }
  return;
}

Assistant:

void
sylvan_init_hash(void)
{
    // initialize sylvan_tabhash_table
    for (int i=0; i<256*16; i++) sylvan_tabhash_table[i] = CWhash(i);
}